

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<long_(const_void_*,_long)>::Matches
          (TypedExpectation<long_(const_void_*,_long)> *this,ArgumentTuple *args)

{
  MatcherInterface<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  DummyMatchResultListener dummy;
  int iVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar2 = TuplePrefix<2ul>::
          Matches<std::tr1::tuple<testing::Matcher<void_const*>,testing::Matcher<long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<void_const*,long,void,void,void,void,void,void,void,void>>
                    (&this->matchers_,args);
  if (bVar2) {
    pMVar1 = (this->extra_matcher_).
             super_MatcherBase<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
             .impl_.value_;
    iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,args);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }